

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O3

void __thiscall Assembler::printSymbolTable(Assembler *this)

{
  ostream *poVar1;
  long lVar2;
  long *plVar3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  char *pcVar6;
  ostream *poVar7;
  ofstream file;
  undefined1 auStack_238 [8];
  long local_230;
  filebuf local_228 [8];
  undefined8 uStack_220;
  uint auStack_218 [50];
  char acStack_150 [24];
  ios_base local_138 [264];
  
  std::ofstream::ofstream((ostream *)&local_230,(string *)&this->outputFileName,_S_out);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"Symbol table:",0xd);
  std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
  std::ostream::put((char)&local_230);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"Value\tType\tSection\t\tName\t\tId\t\tSize",0x22);
  std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
  std::ostream::put((char)&local_230);
  std::ostream::flush();
  p_Var4 = (this->symbolTable)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = &(this->symbolTable)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var5) {
    do {
      *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) =
           *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) & 0xffffffb5 | 2;
      lVar2 = *(long *)(local_230 + -0x18);
      if (acStack_150[lVar2 + 1] == '\0') {
        std::ios::widen((char)auStack_238 + (char)lVar2 + '\b');
        acStack_150[lVar2 + 1] = '\x01';
      }
      acStack_150[lVar2] = '0';
      *(undefined8 *)((long)&uStack_220 + *(long *)(local_230 + -0x18)) = 8;
      poVar1 = (ostream *)
               std::ostream::operator<<((ostream *)&local_230,*(int *)&p_Var4[3].field_0x4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
      pcVar6 = "g\t";
      if (*(char *)&p_Var4[3]._M_parent == '\0') {
        pcVar6 = "l\t";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,pcVar6,2);
      *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) =
           *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) & 0xffffffb5 | 2;
      *(undefined8 *)((long)&uStack_220 + *(long *)(local_230 + -0x18)) = 8;
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)&local_230,p_Var4[3]._M_color);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
      lVar2 = *(long *)poVar1;
      poVar7 = poVar1 + *(long *)(lVar2 + -0x18);
      if (poVar1[*(long *)(lVar2 + -0x18) + 0xe1] == (ostream)0x0) {
        std::ios::widen((char)poVar7);
        poVar7[0xe1] = (ostream)0x1;
        lVar2 = *(long *)poVar1;
      }
      poVar7[0xe0] = (ostream)0x20;
      *(undefined8 *)(poVar1 + *(long *)(lVar2 + -0x18) + 0x10) = 8;
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar1,*(char **)(p_Var4 + 2),(long)p_Var4[2]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
      lVar2 = *(long *)poVar1;
      poVar7 = poVar1 + *(long *)(lVar2 + -0x18);
      if (poVar1[*(long *)(lVar2 + -0x18) + 0xe1] == (ostream)0x0) {
        std::ios::widen((char)poVar7);
        poVar7[0xe1] = (ostream)0x1;
        lVar2 = *(long *)poVar1;
      }
      poVar7[0xe0] = (ostream)0x30;
      *(undefined8 *)(poVar1 + *(long *)(lVar2 + -0x18) + 0x10) = 8;
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*(ushort *)&p_Var4[3]._M_left);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
      *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) =
           *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) & 0xffffffb5 | 2;
      *(undefined8 *)((long)&uStack_220 + *(long *)(local_230 + -0x18)) = 8;
      lVar2 = *(long *)(local_230 + -0x18);
      if (acStack_150[lVar2 + 1] == '\0') {
        std::ios::widen((char)auStack_238 + (char)lVar2 + '\b');
        acStack_150[lVar2 + 1] = '\x01';
      }
      acStack_150[lVar2] = '0';
      plVar3 = (long *)std::ostream::operator<<
                                 ((ostream *)&local_230,*(int *)((long)&p_Var4[3]._M_parent + 4));
      std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
      std::ostream::put((char)plVar3);
      std::ostream::flush();
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var5);
  }
  *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) =
       *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) & 0xffffffb5 | 2;
  std::ios::widen((char)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
  std::ostream::put((char)&local_230);
  std::ostream::flush();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void Assembler::printSymbolTable() {
    ofstream file(this->outputFileName);

    file << "Symbol table:" << endl;
    file << "Value\tType\tSection\t\tName\t\tId\t\tSize" << endl;
    for (auto &entry: symbolTable) {
        file << dec << setfill('0') << setw(8) << entry.second.value << "\t";
        //file << hex << setfill('0') << setw(8) << (0xffff & entry.second.value) << "\t";

        if (entry.second.isGlobal == false)
            file << "l\t";
        else {
            file << "g\t";
        }
        file << dec << setw(8) << entry.second.section << "\t" << setfill(' ') << setw(8) << entry.second.symbolName
             << "\t"
             << setfill('0')
             << setw(8) << (0xffff & entry.second.id) << "\t";
        file << dec << setw(8) << setfill('0') << entry.second.size << endl;
    }
    file << dec << endl;


}